

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

Vector2 MeasureTextEx(Font font,char *text,float fontSize,float spacing)

{
  Vector2 VVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  CharInfo *pCVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  float fVar16;
  float fVar17;
  int local_88;
  float local_84;
  float local_80;
  float local_7c;
  Rectangle *local_78;
  char *local_70;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  
  local_7c = spacing;
  local_48 = fontSize;
  if ((text == (char *)0x0) || (*text == '\0')) {
    local_84 = (float)font.baseSize;
    fVar12 = 0.0;
    fVar16 = -1.0;
    local_58 = 0.0;
    fVar17 = local_84;
  }
  else {
    lVar11 = 0;
    do {
      lVar2 = lVar11 + 1;
      lVar11 = lVar11 + 1;
    } while (text[lVar2] != '\0');
    local_84 = (float)font.baseSize;
    fVar17 = local_84;
    if ((int)lVar11 - 1U < 0x7fffffff) {
      local_78 = font.recs;
      local_58 = 0.0;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      iVar7 = 0;
      local_80 = local_84 * 1.5;
      fVar12 = 0.0;
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      iVar9 = 0;
      iVar10 = 0;
      local_70 = text;
      do {
        local_88 = 0;
        local_68 = local_58;
        uStack_64 = uStack_54;
        uStack_60 = uStack_50;
        uStack_5c = uStack_4c;
        local_58 = fVar12;
        uStack_54 = uVar13;
        uStack_50 = uVar14;
        uStack_4c = uVar15;
        iVar3 = GetNextCodepoint(local_70 + iVar7,&local_88);
        uVar6 = 0x3f;
        if (0 < font.charsCount) {
          uVar5 = 0;
          pCVar8 = font.chars;
          do {
            uVar6 = uVar5;
            if (pCVar8->value == iVar3) break;
            uVar5 = uVar5 + 1;
            pCVar8 = pCVar8 + 1;
            uVar6 = 0x3f;
          } while ((uint)font.charsCount != uVar5);
        }
        iVar4 = 1;
        if ((iVar3 == 0x3f) || (iVar4 = local_88, iVar3 != 10)) {
          iVar9 = iVar9 + 1;
          if (font.chars[uVar6].advanceX == 0) {
            fVar12 = (float)font.chars[uVar6].offsetX + local_78[uVar6].width;
          }
          else {
            fVar12 = (float)font.chars[uVar6].advanceX;
          }
          fVar12 = local_58 + fVar12;
          uVar13 = uStack_54;
          uVar14 = uStack_50;
          uVar15 = uStack_4c;
          local_58 = local_68;
          uStack_54 = uStack_64;
          uStack_50 = uStack_60;
          uStack_4c = uStack_5c;
        }
        else {
          if (local_58 <= local_68) {
            local_58 = local_68;
          }
          fVar17 = fVar17 + local_80;
          fVar12 = 0.0;
          iVar9 = 0;
          uVar13 = 0;
          uVar14 = 0;
          uVar15 = 0;
        }
        if (iVar10 <= iVar9) {
          iVar10 = iVar9;
        }
        iVar7 = iVar7 + iVar4;
      } while (iVar7 < (int)lVar11);
      fVar16 = (float)(iVar10 + -1);
    }
    else {
      fVar12 = 0.0;
      fVar16 = -1.0;
      local_58 = 0.0;
    }
  }
  if (fVar12 <= local_58) {
    fVar12 = local_58;
  }
  VVar1.y = (local_48 / local_84) * fVar17;
  VVar1.x = fVar12 * (local_48 / local_84) + fVar16 * local_7c;
  return VVar1;
}

Assistant:

Vector2 MeasureTextEx(Font font, const char *text, float fontSize, float spacing)
{
    int len = TextLength(text);
    int tempLen = 0;                // Used to count longer text line num chars
    int lenCounter = 0;

    float textWidth = 0.0f;
    float tempTextWidth = 0.0f;     // Used to count longer text line width

    float textHeight = (float)font.baseSize;
    float scaleFactor = fontSize/(float)font.baseSize;

    int letter = 0;                 // Current character
    int index = 0;                  // Index position in sprite font

    for (int i = 0; i < len; i++)
    {
        lenCounter++;

        int next = 0;
        letter = GetNextCodepoint(&text[i], &next);
        index = GetGlyphIndex(font, letter);

        // NOTE: normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set next = 1
        if (letter == 0x3f) next = 1;
        i += next - 1;

        if (letter != '\n')
        {
            if (font.chars[index].advanceX != 0) textWidth += font.chars[index].advanceX;
            else textWidth += (font.recs[index].width + font.chars[index].offsetX);
        }
        else
        {
            if (tempTextWidth < textWidth) tempTextWidth = textWidth;
            lenCounter = 0;
            textWidth = 0;
            textHeight += ((float)font.baseSize*1.5f); // NOTE: Fixed line spacing of 1.5 lines
        }

        if (tempLen < lenCounter) tempLen = lenCounter;
    }

    if (tempTextWidth < textWidth) tempTextWidth = textWidth;

    Vector2 vec = { 0 };
    vec.x = tempTextWidth*scaleFactor + (float)((tempLen - 1)*spacing); // Adds chars spacing to measure
    vec.y = textHeight*scaleFactor;

    return vec;
}